

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O3

_Bool rc_encode(lzma_range_encoder *rc,uint8_t *out,size_t *out_pos,size_t out_size)

{
  uint64_t *puVar1;
  ushort uVar2;
  ushort *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  uint uVar8;
  uint64_t uVar9;
  
  if (0x3a < rc->count) {
    __assert_fail("rc->count <= RC_SYMBOLS_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                  ,0x9a,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
  }
  uVar5 = rc->pos;
  if (uVar5 < rc->count) {
    uVar4 = (ulong)rc->range;
    do {
      uVar6 = (uint32_t)uVar4;
      if (uVar6 < 0x1000000) {
        uVar4 = rc->low;
        if ((uVar4 & 0xffffffffff000000) == 0xff000000) {
          uVar9 = rc->cache_size + 1;
        }
        else {
          do {
            if (*out_pos == out_size) {
              return true;
            }
            out[*out_pos] = rc->cache + *(char *)((long)&rc->low + 4);
            *out_pos = *out_pos + 1;
            rc->cache = 0xff;
            puVar1 = &rc->cache_size;
            *puVar1 = *puVar1 - 1;
          } while (*puVar1 != 0);
          uVar4 = rc->low;
          rc->cache = (uint8_t)(uVar4 >> 0x18);
          uVar6 = rc->range;
          uVar5 = rc->pos;
          uVar9 = 1;
        }
        rc->cache_size = uVar9;
        rc->low = (ulong)(uint)((int)uVar4 << 8);
        uVar6 = uVar6 << 8;
        rc->range = uVar6;
      }
      switch(rc->symbols[uVar5]) {
      case RC_BIT_0:
        puVar3 = rc->probs[uVar5];
        uVar2 = *puVar3;
        uVar8 = (uVar6 >> 0xb) * (uint)uVar2;
        uVar4 = (ulong)uVar8;
        rc->range = uVar8;
        *puVar3 = (short)(0x800 - uVar2 >> 5) + uVar2;
        break;
      case RC_BIT_1:
        puVar3 = rc->probs[uVar5];
        uVar2 = *puVar3;
        uVar8 = (uVar6 >> 0xb) * (uint)uVar2;
        rc->low = rc->low + (ulong)uVar8;
        uVar8 = uVar6 - uVar8;
        uVar4 = (ulong)uVar8;
        rc->range = uVar8;
        *puVar3 = uVar2 - (uVar2 >> 5);
        break;
      case RC_DIRECT_0:
        uVar4 = (ulong)(uVar6 >> 1);
        rc->range = uVar6 >> 1;
        break;
      case RC_DIRECT_1:
        uVar4 = (ulong)(uVar6 >> 1);
        rc->range = uVar6 >> 1;
        rc->low = rc->low + uVar4;
        break;
      case RC_FLUSH:
        rc->range = 0xffffffff;
        uVar9 = rc->low;
        do {
          if ((uVar9 & 0xffffffffff000000) == 0xff000000) {
            uVar7 = rc->cache_size + 1;
          }
          else {
            do {
              if (*out_pos == out_size) {
                return true;
              }
              out[*out_pos] = rc->cache + *(char *)((long)&rc->low + 4);
              *out_pos = *out_pos + 1;
              rc->cache = 0xff;
              puVar1 = &rc->cache_size;
              *puVar1 = *puVar1 - 1;
            } while (*puVar1 != 0);
            uVar9 = rc->low;
            uVar5 = rc->pos;
            rc->cache = (uint8_t)(uVar9 >> 0x18);
            uVar7 = 1;
          }
          rc->cache_size = uVar7;
          uVar9 = (uint64_t)(uint)((int)uVar9 << 8);
          rc->low = uVar9;
          uVar5 = uVar5 + 1;
          rc->pos = uVar5;
        } while (uVar5 < rc->count);
        rc->low = 0;
        rc->cache_size = 1;
        rc->range = 0xffffffff;
        rc->cache = '\0';
        goto LAB_00196d7f;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                      ,0xd4,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
      }
      uVar5 = uVar5 + 1;
      rc->pos = uVar5;
    } while (uVar5 < rc->count);
  }
LAB_00196d7f:
  rc->count = 0;
  rc->pos = 0;
  return false;
}

Assistant:

static inline bool
rc_encode(lzma_range_encoder *rc,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	assert(rc->count <= RC_SYMBOLS_MAX);

	while (rc->pos < rc->count) {
		// Normalize
		if (rc->range < RC_TOP_VALUE) {
			if (rc_shift_low(rc, out, out_pos, out_size))
				return true;

			rc->range <<= RC_SHIFT_BITS;
		}

		// Encode a bit
		switch (rc->symbols[rc->pos]) {
		case RC_BIT_0: {
			probability prob = *rc->probs[rc->pos];
			rc->range = (rc->range >> RC_BIT_MODEL_TOTAL_BITS)
					* prob;
			prob += (RC_BIT_MODEL_TOTAL - prob) >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_BIT_1: {
			probability prob = *rc->probs[rc->pos];
			const uint32_t bound = prob * (rc->range
					>> RC_BIT_MODEL_TOTAL_BITS);
			rc->low += bound;
			rc->range -= bound;
			prob -= prob >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_DIRECT_0:
			rc->range >>= 1;
			break;

		case RC_DIRECT_1:
			rc->range >>= 1;
			rc->low += rc->range;
			break;

		case RC_FLUSH:
			// Prevent further normalizations.
			rc->range = UINT32_MAX;

			// Flush the last five bytes (see rc_flush()).
			do {
				if (rc_shift_low(rc, out, out_pos, out_size))
					return true;
			} while (++rc->pos < rc->count);

			// Reset the range encoder so we are ready to continue
			// encoding if we weren't finishing the stream.
			rc_reset(rc);
			return false;

		default:
			assert(0);
			break;
		}

		++rc->pos;
	}

	rc->count = 0;
	rc->pos = 0;

	return false;
}